

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadbase.c
# Opt level: O2

int scanForQuads(StructureConfig sconf,int radius,uint64_t s48,uint64_t *lowBits,int lowBitN,
                uint64_t salt,int x,int z,int w,int h,Pos *qplist,int n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int x3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  int z1;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  int reg;
  int iVar24;
  int iVar25;
  int z3;
  uint uVar26;
  uint uVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  ulong uVar32;
  float fVar33;
  float fVar34;
  float __x;
  float fVar35;
  int az;
  int R;
  long local_c0;
  
  if (lowBitN == 0x14) {
    local_c0 = 0x2057d;
  }
  else if (lowBitN == 0x30) {
    local_c0 = 0xc0654be2057d;
  }
  else {
    uVar20 = 1L << ((byte)lowBitN & 0x3f);
    if ((long)uVar20 < 2) {
      local_c0 = 0;
    }
    else {
      local_c0 = 0;
      uVar7 = 0x1ef1565bd5;
      uVar32 = uVar20;
      lVar8 = 1;
      lVar14 = 0;
      while (1 < (long)uVar7) {
        if (uVar32 == 0) goto LAB_00122c51;
        uVar9 = uVar7 % uVar32;
        lVar21 = lVar8 - (uVar7 / uVar32) * lVar14;
        uVar7 = uVar32;
        uVar32 = uVar9;
        lVar8 = lVar14;
        lVar14 = lVar21;
      }
      local_c0 = (lVar8 >> 0x3f & uVar20) + lVar8;
    }
  }
LAB_00122c51:
  lVar21 = 1L << ((byte)lowBitN & 0x3f);
  uVar7 = (ulong)z;
  lVar8 = (long)sconf.salt;
  reg = sconf._1_4_ >> 0x18;
  iVar25 = sconf._2_4_ >> 0x18;
  uVar10 = (radius / 8) * (radius / 8);
  iVar1 = (reg - iVar25) + 1;
  __x = (float)(int)(uVar10 - iVar1 * iVar1);
  iVar1 = (radius * -2 + 0x41) / 8 + reg * 2;
  fVar35 = SQRT(__x);
  uVar20 = lVar21 - 1;
  lVar14 = 0;
  iVar6 = 0;
  do {
    if (lowBits[lVar14] == 0) {
      return iVar6;
    }
    if (iVar6 < n) {
      uVar32 = lowBits[lVar14] - salt & uVar20;
      iVar5 = 0;
      for (lVar22 = (long)x; lVar22 <= (long)w + (long)x; lVar22 = lVar22 + 1) {
        uVar9 = (lVar22 * -0x4f9939f508 + (uVar32 - s48)) * local_c0 & uVar20 | -lVar21 & uVar7;
        lVar29 = 0;
        if ((long)uVar9 < (long)uVar7) {
          lVar29 = lVar21;
        }
        lVar29 = lVar29 + uVar9;
        lVar30 = lVar29 * -0x100000000;
        for (; lVar29 <= (long)((long)h + uVar7); lVar29 = lVar29 + lVar21) {
          uVar9 = (lVar30 >> 0x20) * 0xffe10ea9a42b +
                  (lVar22 * -0x100000000 >> 0x20) * 0xffb066c60af8 + s48 & 0xffffffffffff;
          if ((uVar9 & uVar20) == uVar32) {
            switch(sconf._6_2_ & 0xff) {
            case 1:
            case 2:
            case 4:
            case 5:
              uVar9 = uVar9 + lVar8;
              if (radius == 0x80) {
                uVar12 = (uVar9 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                uVar27 = (uint)(uVar12 >> 0x11) & 0x7fffffff;
                iVar31 = (uVar27 / 3 & 0xfffffff8) * -3 + uVar27;
                if ((0x13 < iVar31) &&
                   (uVar27 = (uint)(uVar12 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                   iVar2 = (uVar27 / 3 & 0xfffffff8) * -3 + uVar27, 0x13 < iVar2)) {
                  uVar12 = (uVar9 + 0x6e8a9050dd ^ 0x5deece66d) * 0x5deece66d + 0xb;
                  uVar27 = (uint)(uVar12 >> 0x11) & 0x7fffffff;
                  iVar15 = (uVar27 / 3 & 0xfffffff8) * -3 + uVar27;
                  if ((iVar15 <= iVar31 + -0x14) &&
                     ((uVar27 = (uint)(uVar12 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                      z1 = (uVar27 / 3 & 0xfffffff8) * -3 + uVar27, z1 <= iVar2 + -0x14 &&
                      (iVar3 = (iVar15 - iVar31) + 0x20, iVar24 = (z1 - iVar2) + 0x20,
                      (uint)(iVar24 * iVar24 + iVar3 * iVar3) < 0x100)))) {
                    uVar12 = (uVar9 + 0x4f9939f508 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                    uVar27 = (uint)(uVar12 >> 0x11) & 0x7fffffff;
                    iVar3 = (uVar27 / 3 & 0xfffffff8) * -3 + uVar27;
                    if ((iVar3 < 4) &&
                       (uVar27 = (uint)(uVar12 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                       iVar24 = (uVar27 / 3 & 0xfffffff8) * -3 + uVar27, 0x13 < iVar24)) {
                      uVar9 = (uVar9 + 0x1ef1565bd5 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                      uVar27 = (uint)(uVar9 >> 0x11) & 0x7fffffff;
                      x3 = (uVar27 / 3 & 0xfffffff8) * -3 + uVar27;
                      if (((0x13 < x3) &&
                          (uVar27 = (uint)(uVar9 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                          z3 = (uVar27 / 3 & 0xfffffff8) * -3 + uVar27, z3 < 4)) &&
                         (iVar28 = (iVar3 - x3) + 0x20, iVar19 = (z3 - iVar24) + 0x20,
                         (uint)(iVar19 * iVar19 + iVar28 * iVar28) < 0x100)) {
                        az = 0;
                        iVar28 = 0;
                        iVar19 = 0;
LAB_001239c2:
                        fVar34 = getEnclosingRadius(iVar31,iVar2,iVar15,z1,iVar3,iVar24,x3,z3,iVar19
                                                    ,iVar28,az,0x20,0x80);
                        fVar33 = 128.0;
LAB_001241eb:
                        if ((fVar34 < fVar33) && ((fVar34 != 0.0 || (NAN(fVar34))))) {
                          qplist[(long)iVar6 + (long)iVar5].x = (int)lVar22;
                          qplist[(long)iVar6 + (long)iVar5].z = (int)lVar29;
                          iVar5 = iVar5 + 1;
                          if (n - iVar6 <= iVar5) goto LAB_00124292;
                        }
                      }
                    }
                  }
                }
              }
              else {
                fVar33 = fVar35;
                if (__x < 0.0) {
                  fVar33 = sqrtf(__x);
                }
                iVar31 = reg - (int)fVar33;
                uVar12 = (uVar9 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                uVar27 = (uint)((long)(ulong)((uint)(uVar12 >> 0x11) & 0x7fffffff) % (long)iVar25);
                if (iVar31 < (int)uVar27) {
                  uVar23 = (uint)((long)(ulong)((uint)(uVar12 * 0x5deece66d + 0xb >> 0x11) &
                                               0x7fffffff) % (long)iVar25);
                  if (iVar31 < (int)uVar23) {
                    uVar12 = (uVar9 + 0x6e8a9050dd ^ 0x5deece66d) * 0x5deece66d + 0xb;
                    uVar11 = (uint)((long)(ulong)((uint)(uVar12 >> 0x11) & 0x7fffffff) %
                                   (long)iVar25);
                    if ((((int)uVar11 < (int)(uVar27 - iVar31)) &&
                        (uVar26 = (uint)((long)(ulong)((uint)(uVar12 * 0x5deece66d + 0xb >> 0x11) &
                                                      0x7fffffff) % (long)iVar25),
                        (int)uVar26 < (int)(uVar23 - iVar31))) &&
                       (iVar2 = (reg - uVar27) + uVar11, iVar15 = (reg - uVar23) + uVar26,
                       (uint)(iVar15 * iVar15 + iVar2 * iVar2) <= uVar10)) {
                      uVar12 = (uVar9 + 0x4f9939f508 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                      uVar16 = (uint)((long)(uVar12 >> 0x11 & 0x7fffffff) % (long)iVar25);
                      if (((int)uVar16 < iVar25 - iVar31) &&
                         (uVar17 = (uint)((long)(ulong)((uint)(uVar12 * 0x5deece66d + 0xb >> 0x11) &
                                                       0x7fffffff) % (long)iVar25),
                         iVar31 < (int)uVar17)) {
                        uVar9 = (uVar9 + 0x1ef1565bd5 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                        uVar18 = (uint)((long)(ulong)((uint)(uVar9 >> 0x11) & 0x7fffffff) %
                                       (long)iVar25);
                        if ((iVar31 < (int)uVar18) &&
                           (uVar4 = (uint)((long)(ulong)((uint)(uVar9 * 0x5deece66d + 0xb >> 0x11) &
                                                        0x7fffffff) % (long)iVar25),
                           uVar4 < (uint)(iVar25 - iVar31))) goto LAB_00123b4f;
                      }
                    }
                  }
                }
              }
              break;
            case 3:
              uVar9 = uVar9 + lVar8;
              if (radius == 0x80) {
                uVar12 = (uVar9 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                uVar27 = (uint)(uVar12 >> 0x11) & 0x7fffffff;
                iVar31 = (uVar27 / 3 & 0xfffffff8) * -3 + uVar27;
                if ((0x13 < iVar31) &&
                   (uVar27 = (uint)(uVar12 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                   iVar2 = (uVar27 / 3 & 0xfffffff8) * -3 + uVar27, 0x13 < iVar2)) {
                  uVar12 = (uVar9 + 0x6e8a9050dd ^ 0x5deece66d) * 0x5deece66d + 0xb;
                  uVar27 = (uint)(uVar12 >> 0x11) & 0x7fffffff;
                  iVar15 = (uVar27 / 3 & 0xfffffff8) * -3 + uVar27;
                  if ((iVar15 <= iVar31 + -0x14) &&
                     ((uVar27 = (uint)(uVar12 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                      z1 = (uVar27 / 3 & 0xfffffff8) * -3 + uVar27, z1 <= iVar2 + -0x14 &&
                      (iVar3 = (iVar15 - iVar31) + 0x20, iVar24 = (z1 - iVar2) + 0x20,
                      (uint)(iVar24 * iVar24 + iVar3 * iVar3) < 0x100)))) {
                    uVar12 = (uVar9 + 0x4f9939f508 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                    uVar27 = (uint)(uVar12 >> 0x11) & 0x7fffffff;
                    iVar3 = (uVar27 / 3 & 0xfffffff8) * -3 + uVar27;
                    if ((iVar3 < 4) &&
                       (uVar27 = (uint)(uVar12 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                       iVar24 = (uVar27 / 3 & 0xfffffff8) * -3 + uVar27, 0x13 < iVar24)) {
                      uVar9 = (uVar9 + 0x1ef1565bd5 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                      uVar27 = (uint)(uVar9 >> 0x11) & 0x7fffffff;
                      x3 = (uVar27 / 3 & 0xfffffff8) * -3 + uVar27;
                      if (((0x13 < x3) &&
                          (uVar27 = (uint)(uVar9 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                          z3 = (uVar27 / 3 & 0xfffffff8) * -3 + uVar27, z3 < 4)) &&
                         (iVar28 = (iVar3 - x3) + 0x20, iVar19 = (z3 - iVar24) + 0x20,
                         (uint)(iVar19 * iVar19 + iVar28 * iVar28) < 0x100)) {
                        az = 10;
                        iVar28 = 8;
                        iVar19 = 8;
                        goto LAB_001239c2;
                      }
                    }
                  }
                }
              }
              else {
                fVar33 = fVar35;
                if (__x < 0.0) {
                  fVar33 = sqrtf(__x);
                }
                iVar31 = reg - (int)fVar33;
                uVar12 = (uVar9 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                uVar27 = (uint)((long)(ulong)((uint)(uVar12 >> 0x11) & 0x7fffffff) % (long)iVar25);
                if (iVar31 < (int)uVar27) {
                  uVar23 = (uint)((long)(ulong)((uint)(uVar12 * 0x5deece66d + 0xb >> 0x11) &
                                               0x7fffffff) % (long)iVar25);
                  if (iVar31 < (int)uVar23) {
                    uVar12 = (uVar9 + 0x6e8a9050dd ^ 0x5deece66d) * 0x5deece66d + 0xb;
                    uVar11 = (uint)((long)(ulong)((uint)(uVar12 >> 0x11) & 0x7fffffff) %
                                   (long)iVar25);
                    if ((((int)uVar11 < (int)(uVar27 - iVar31)) &&
                        (uVar26 = (uint)((long)(ulong)((uint)(uVar12 * 0x5deece66d + 0xb >> 0x11) &
                                                      0x7fffffff) % (long)iVar25),
                        (int)uVar26 < (int)(uVar23 - iVar31))) &&
                       (iVar2 = (reg - uVar27) + uVar11, iVar15 = (reg - uVar23) + uVar26,
                       (uint)(iVar15 * iVar15 + iVar2 * iVar2) <= uVar10)) {
                      uVar12 = (uVar9 + 0x4f9939f508 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                      uVar16 = (uint)((long)(uVar12 >> 0x11 & 0x7fffffff) % (long)iVar25);
                      if (((int)uVar16 < iVar25 - iVar31) &&
                         (uVar17 = (uint)((long)(ulong)((uint)(uVar12 * 0x5deece66d + 0xb >> 0x11) &
                                                       0x7fffffff) % (long)iVar25),
                         iVar31 < (int)uVar17)) {
                        uVar9 = (uVar9 + 0x1ef1565bd5 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                        uVar18 = (uint)((long)(ulong)((uint)(uVar9 >> 0x11) & 0x7fffffff) %
                                       (long)iVar25);
                        if ((iVar31 < (int)uVar18) &&
                           ((uVar4 = (uint)((long)(ulong)((uint)(uVar9 * 0x5deece66d + 0xb >> 0x11)
                                                         & 0x7fffffff) % (long)iVar25),
                            uVar4 < (uint)(iVar25 - iVar31) &&
                            (iVar31 = (uVar16 + reg) - uVar18, iVar2 = (reg - uVar17) + uVar4,
                            (uint)(iVar2 * iVar2 + iVar31 * iVar31) <= uVar10)))) {
                          iVar15 = 10;
                          iVar31 = 8;
                          iVar2 = 8;
                          goto LAB_001241dc;
                        }
                      }
                    }
                  }
                }
              }
              break;
            case 6:
            case 7:
            case 0xb:
              fVar33 = fVar35;
              if (__x < 0.0) {
                fVar33 = sqrtf(__x);
              }
              uVar9 = uVar9 + lVar8;
              iVar31 = reg - (int)fVar33;
              uVar12 = (uVar9 ^ 0x5deece66d) * 0x5deece66d + 0xb;
              uVar27 = (uint)((long)(ulong)((uint)(uVar12 >> 0x11) & 0x7fffffff) % (long)iVar25);
              if (iVar31 < (int)uVar27) {
                uVar23 = (uint)((long)(ulong)((uint)(uVar12 * 0x5deece66d + 0xb >> 0x11) &
                                             0x7fffffff) % (long)iVar25);
                if (iVar31 < (int)uVar23) {
                  uVar12 = (uVar9 + 0x6e8a9050dd ^ 0x5deece66d) * 0x5deece66d + 0xb;
                  uVar11 = (uint)((long)(ulong)((uint)(uVar12 >> 0x11) & 0x7fffffff) % (long)iVar25)
                  ;
                  if ((((int)uVar11 < (int)(uVar27 - iVar31)) &&
                      (uVar26 = (uint)((long)(ulong)((uint)(uVar12 * 0x5deece66d + 0xb >> 0x11) &
                                                    0x7fffffff) % (long)iVar25),
                      (int)uVar26 < (int)(uVar23 - iVar31))) &&
                     (iVar2 = (reg - uVar27) + uVar11, iVar15 = (reg - uVar23) + uVar26,
                     (uint)(iVar15 * iVar15 + iVar2 * iVar2) <= uVar10)) {
                    uVar12 = (uVar9 + 0x4f9939f508 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                    uVar16 = (uint)((long)(uVar12 >> 0x11 & 0x7fffffff) % (long)iVar25);
                    if (((int)uVar16 < iVar25 - iVar31) &&
                       (uVar17 = (uint)((long)(ulong)((uint)(uVar12 * 0x5deece66d + 0xb >> 0x11) &
                                                     0x7fffffff) % (long)iVar25),
                       iVar31 < (int)uVar17)) {
                      uVar9 = (uVar9 + 0x1ef1565bd5 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                      uVar18 = (uint)((long)(ulong)((uint)(uVar9 >> 0x11) & 0x7fffffff) %
                                     (long)iVar25);
                      if ((iVar31 < (int)uVar18) &&
                         (uVar4 = (uint)((long)(ulong)((uint)(uVar9 * 0x5deece66d + 0xb >> 0x11) &
                                                      0x7fffffff) % (long)iVar25),
                         uVar4 < (uint)(iVar25 - iVar31))) {
LAB_00123b4f:
                        iVar31 = (uVar16 + reg) - uVar18;
                        iVar2 = (reg - uVar17) + uVar4;
                        if ((uint)(iVar2 * iVar2 + iVar31 * iVar31) <= uVar10) {
                          iVar15 = 0;
                          iVar2 = 0;
                          iVar31 = 0;
                          goto LAB_001241dc;
                        }
                      }
                    }
                  }
                }
              }
              break;
            case 8:
              uVar9 = uVar9 + lVar8;
              uVar12 = (uVar9 ^ 0x5deece66d) * 0x5deece66d + 0xb;
              uVar13 = uVar12 * 0x5deece66d + 0xb;
              uVar27 = (int)((long)(ulong)((uint)(uVar13 >> 0x11) & 0x7fffffff) % (long)iVar25) +
                       (int)((long)(ulong)((uint)(uVar12 >> 0x11) & 0x7fffffff) % (long)iVar25);
              if (iVar1 < (int)uVar27) {
                uVar12 = uVar13 * 0x5deece66d + 0xb;
                uVar23 = (int)((long)(ulong)((uint)(uVar12 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff
                                            ) % (long)iVar25) +
                         (int)((long)(ulong)((uint)(uVar12 >> 0x11) & 0x7fffffff) % (long)iVar25);
                if (iVar1 < (int)uVar23) {
                  uVar12 = (uVar9 + 0x6e8a9050dd ^ 0x5deece66d) * 0x5deece66d + 0xb;
                  uVar13 = uVar12 * 0x5deece66d + 0xb;
                  uVar11 = (int)((long)(ulong)((uint)(uVar13 >> 0x11) & 0x7fffffff) % (long)iVar25)
                           + (int)((long)(uVar12 >> 0x11 & 0x7fffffff) % (long)iVar25);
                  if ((((int)uVar11 <= (int)(uVar27 - iVar1)) &&
                      (uVar12 = uVar13 * 0x5deece66d + 0xb,
                      uVar26 = (int)((long)(ulong)((uint)(uVar12 * 0x5deece66d + 0xb >> 0x11) &
                                                  0x7fffffff) % (long)iVar25) +
                               (int)((long)(uVar12 >> 0x11 & 0x7fffffff) % (long)iVar25),
                      (int)uVar26 <= (int)(uVar23 - iVar1))) &&
                     (iVar31 = (int)(uVar11 - uVar27) >> 1, iVar2 = (int)(uVar26 - uVar23) >> 1,
                     (ulong)(uint)(iVar2 * iVar2 + iVar31 * iVar31) <=
                     (ulong)((long)radius * (long)radius * 4))) {
                    uVar12 = (uVar9 + 0x4f9939f508 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                    uVar13 = uVar12 * 0x5deece66d + 0xb;
                    uVar16 = (int)((long)(uVar13 >> 0x11 & 0x7fffffff) % (long)iVar25) +
                             (int)((long)(uVar12 >> 0x11 & 0x7fffffff) % (long)iVar25);
                    if ((uVar16 <= uVar27 - iVar1) &&
                       (uVar12 = uVar13 * 0x5deece66d + 0xb,
                       uVar17 = (int)((long)(ulong)((uint)(uVar12 * 0x5deece66d + 0xb >> 0x11) &
                                                   0x7fffffff) % (long)iVar25) +
                                (int)((long)(uVar12 >> 0x11 & 0x7fffffff) % (long)iVar25),
                       iVar1 < (int)uVar17)) {
                      uVar9 = (uVar9 + 0x1ef1565bd5 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                      uVar12 = uVar9 * 0x5deece66d + 0xb;
                      uVar18 = (int)((long)(uVar12 >> 0x11 & 0x7fffffff) % (long)iVar25) +
                               (int)((long)(uVar9 >> 0x11 & 0x7fffffff) % (long)iVar25);
                      if ((iVar1 < (int)uVar18) &&
                         (uVar9 = uVar12 * 0x5deece66d + 0xb,
                         uVar4 = (int)((long)(ulong)((uint)(uVar9 * 0x5deece66d + 0xb >> 0x11) &
                                                    0x7fffffff) % (long)iVar25) +
                                 (int)((long)(uVar9 >> 0x11 & 0x7fffffff) % (long)iVar25),
                         uVar4 <= uVar23 - iVar1)) {
                        uVar27 = uVar27 >> 1;
                        uVar23 = uVar23 >> 1;
                        uVar11 = uVar11 >> 1;
                        uVar26 = uVar26 >> 1;
                        uVar16 = uVar16 >> 1;
                        uVar17 = uVar17 >> 1;
                        uVar18 = uVar18 >> 1;
                        uVar4 = uVar4 >> 1;
                        iVar15 = 0x3a;
                        iVar2 = 0x17;
                        iVar31 = 0x3a;
LAB_001241dc:
                        fVar34 = getEnclosingRadius(uVar27,uVar23,uVar11,uVar26,uVar16,uVar17,uVar18
                                                    ,uVar4,iVar31,iVar2,iVar15,reg,radius);
                        fVar33 = (float)radius;
                        goto LAB_001241eb;
                      }
                    }
                  }
                }
              }
              break;
            default:
              fprintf(_stderr,"isQuadBase: not implemented for structure type %d\n",
                      sconf._0_8_ >> 0x30 & 0xff);
              exit(-1);
            case 10:
              fVar33 = fVar35;
              if (__x < 0.0) {
                fVar33 = sqrtf(__x);
              }
              uVar9 = uVar9 + lVar8;
              iVar31 = reg - (int)fVar33;
              uVar12 = (uVar9 ^ 0x5deece66d) * 0x5deece66d + 0xb;
              uVar27 = (uint)((long)(ulong)((uint)(uVar12 >> 0x11) & 0x7fffffff) % (long)iVar25);
              if (iVar31 < (int)uVar27) {
                uVar23 = (uint)((long)(ulong)((uint)(uVar12 * 0x5deece66d + 0xb >> 0x11) &
                                             0x7fffffff) % (long)iVar25);
                if (iVar31 < (int)uVar23) {
                  uVar12 = (uVar9 + 0x6e8a9050dd ^ 0x5deece66d) * 0x5deece66d + 0xb;
                  uVar11 = (uint)((long)(ulong)((uint)(uVar12 >> 0x11) & 0x7fffffff) % (long)iVar25)
                  ;
                  if ((((int)uVar11 < (int)(uVar27 - iVar31)) &&
                      (uVar26 = (uint)((long)(ulong)((uint)(uVar12 * 0x5deece66d + 0xb >> 0x11) &
                                                    0x7fffffff) % (long)iVar25),
                      (int)uVar26 < (int)(uVar23 - iVar31))) &&
                     (iVar2 = (reg - uVar27) + uVar11, iVar15 = (reg - uVar23) + uVar26,
                     (uint)(iVar15 * iVar15 + iVar2 * iVar2) <= uVar10)) {
                    uVar12 = (uVar9 + 0x4f9939f508 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                    uVar16 = (uint)((long)(uVar12 >> 0x11 & 0x7fffffff) % (long)iVar25);
                    if (((int)uVar16 < iVar25 - iVar31) &&
                       (uVar17 = (uint)((long)(ulong)((uint)(uVar12 * 0x5deece66d + 0xb >> 0x11) &
                                                     0x7fffffff) % (long)iVar25),
                       iVar31 < (int)uVar17)) {
                      uVar9 = (uVar9 + 0x1ef1565bd5 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                      uVar18 = (uint)((long)(ulong)((uint)(uVar9 >> 0x11) & 0x7fffffff) %
                                     (long)iVar25);
                      if ((iVar31 < (int)uVar18) &&
                         ((uVar4 = (uint)((long)(ulong)((uint)(uVar9 * 0x5deece66d + 0xb >> 0x11) &
                                                       0x7fffffff) % (long)iVar25),
                          uVar4 < (uint)(iVar25 - iVar31) &&
                          (iVar31 = (uVar16 + reg) - uVar18, iVar2 = (reg - uVar17) + uVar4,
                          (uint)(iVar2 * iVar2 + iVar31 * iVar31) <= uVar10)))) {
                        iVar31 = 0x48;
                        iVar15 = 0x48;
                        iVar2 = 0x36;
                        goto LAB_001241dc;
                      }
                    }
                  }
                }
              }
            }
          }
          lVar30 = lVar30 - (lVar21 << 0x20);
        }
      }
    }
    else {
      iVar5 = 0;
    }
LAB_00124292:
    iVar6 = iVar5 + iVar6;
    lVar14 = lVar14 + 1;
    if (n <= iVar6) {
      return iVar6;
    }
  } while( true );
}

Assistant:

int scanForQuads(
        const StructureConfig sconf, int radius, uint64_t s48,
        const uint64_t *lowBits, int lowBitN, uint64_t salt,
        int x, int z, int w, int h, Pos *qplist, int n)
{
    int i, cnt = 0;
    uint64_t invB;
    if (lowBitN == 20)
        invB = 132477ULL;
    else if (lowBitN == 48)
        invB = 211541297333629ULL;
    else
        invB = mulInv(132897987541ULL, (1ULL << lowBitN));

    for (i = 0; lowBits[i]; i++)
    {
        cnt += scanForQuadBits(sconf, radius, s48, lowBits[i]-salt, lowBitN, invB,
                x, z, w, h, qplist+cnt, n-cnt);
        if (cnt >= n)
            break;
    }

    return cnt;
}